

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_settable_sskey(lua_State *L,TValue *t,TValue *key,StkId val)

{
  byte bVar1;
  ushort uVar2;
  lua_CFunction p_Var3;
  TString *key_00;
  TString *pTVar4;
  GCObject *pGVar5;
  TValue *n;
  char *pcVar6;
  
  if (t->tt_ != 0x8005) {
    if ((t->tt_ & 0xf) == 5) {
      luaG_typeerror(L,t,"incorrectly index");
    }
    n = (TValue *)0x0;
    goto LAB_00130f1e;
  }
  p_Var3 = (t->value_).f;
  if (p_Var3[8] != (_func_int_lua_State_ptr)0x5) {
    pcVar6 = "(((t)->value_).gc)->tt == 5";
    goto LAB_00130fbe;
  }
  if ((key->tt_ & 0xf) != 4) {
    pcVar6 = "(((((((key))->tt_)) & 0x0F)) == (4))";
    goto LAB_00130fbe;
  }
  key_00 = (TString *)(key->value_).gc;
  if ((key_00->tt & 0xf) != 4) {
    pcVar6 = "(((((key)->value_).gc)->tt) & 0x0F) == 4";
    goto LAB_00130fbe;
  }
  if (key_00->tt != 4) {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  n = (TValue *)((ulong)(*(uint *)(p_Var3 + 0x38) & key_00->hash) * 0x20 + *(long *)(p_Var3 + 0x18))
  ;
  if ((((Node *)n)->i_key).nk.tt_ == 0x8004) {
    pTVar4 = (TString *)(((Node *)n)->i_key).nk.value_.gc;
    bVar1 = pTVar4->tt;
    if ((bVar1 & 0xf) != 4) {
      pcVar6 = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
LAB_00130f96:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (bVar1 != 4) {
      pcVar6 = 
      "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
      goto LAB_00130f96;
    }
    if (pTVar4 != key_00) goto LAB_00130e6b;
  }
  else {
LAB_00130e6b:
    if ((((Node *)n)->i_key).nk.next == 0) {
      n = &luaO_nilobject_;
    }
    else {
      n = luaH_getshortstr_continue(key_00,(Node *)n);
    }
  }
  if ((((Node *)n)->i_val).tt_ == 0) {
LAB_00130f1e:
    luaV_finishset(L,t,key,val,n);
    return;
  }
  (((Node *)n)->i_val).value_ = val->value_;
  uVar2 = val->tt_;
  (((Node *)n)->i_val).tt_ = uVar2;
  if (((short)uVar2 < 0) &&
     ((pGVar5 = (((Node *)n)->i_val).value_.gc, (uVar2 & 0x7f) != (ushort)pGVar5->tt ||
      ((L != (lua_State *)0x0 && ((pGVar5->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
    pcVar6 = "0";
LAB_00130fbe:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xc67,"void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
  }
  if ((short)val->tt_ < 0) {
    if (-1 < (short)t->tt_) {
      pcVar6 = "(((t)->tt_) & (1 << 15))";
      goto LAB_00130fbe;
    }
    if (((((t->value_).gc)->marked & 0x20) != 0) && ((((val->value_).gc)->marked & 0x18) != 0)) {
      luaC_barrierback_(L,(t->value_).gc);
      return;
    }
  }
  return;
}

Assistant:

void raviV_settable_sskey(lua_State *L, const TValue *t, TValue *key, StkId val) {
  SETTABLE_INLINE_SSKEY(L, t, key, val);
}